

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  stbi_uc **ppsVar1;
  uint uVar2;
  uint uVar3;
  stbi__context *s;
  stbi__context *psVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  stbi_uc sVar8;
  byte bVar9;
  byte bVar10;
  stbi_uc sVar11;
  stbi__uint32 sVar12;
  stbi__uint32 sVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  uint x;
  uint uVar18;
  int depth;
  int iVar19;
  stbi_uc *psVar20;
  char *pcVar21;
  stbi_uc *psVar22;
  size_t sVar23;
  uint uVar24;
  ulong uVar25;
  stbi_uc *psVar26;
  int out_n;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  stbi__uint16 *tc_00;
  uint uVar31;
  stbi__png *z_00;
  uint uVar32;
  long lVar33;
  stbi_uc *__dest;
  long in_FS_OFFSET;
  char local_4e8;
  stbi_uc tc [3];
  ulong local_4d0;
  ulong local_4c0;
  stbi__uint32 local_490;
  stbi__uint32 raw_len;
  ulong local_460;
  stbi__uint16 tc16 [3];
  stbi_uc palette [1024];
  
  tc[2] = '\0';
  tc[0] = '\0';
  tc[1] = '\0';
  s = z->s;
  ppsVar1 = &z->idata;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  lVar33 = 0;
  do {
    sVar8 = stbi__get8(s);
    if (sVar8 != (&stbi__check_png_header_png_sig)[lVar33]) {
      pcVar21 = "bad png sig";
      goto LAB_00143753;
    }
    lVar33 = lVar33 + 1;
  } while (lVar33 != 8);
  if (scan == 1) {
    return 1;
  }
  bVar5 = true;
  bVar9 = 0;
  uVar27 = 0;
  bVar6 = false;
  local_4c0 = 0;
  uVar14 = 0;
  uVar25 = 0;
  bVar7 = false;
  uVar31 = 0;
LAB_001432c5:
  sVar12 = stbi__get32be(s);
  uVar29 = (ulong)sVar12;
  sVar13 = stbi__get32be(s);
  iVar16 = (int)uVar25;
  local_4e8 = (char)uVar31;
  if ((int)sVar13 < 0x49484452) {
    if (sVar13 == 0x43674249) {
      bVar6 = true;
LAB_0014355b:
      stbi__skip(s,sVar12);
      goto LAB_00143568;
    }
    if (sVar13 == 0x49444154) {
      if (bVar5) goto LAB_0014379f;
      if ((local_4e8 == '\0') || ((uint)local_4c0 != 0)) {
        if (scan == 2) {
          s->img_n = uVar31;
          return 1;
        }
        uVar15 = iVar16 + sVar12;
        if ((int)uVar15 < iVar16) {
          return 0;
        }
        if (uVar14 < uVar15) {
          if (sVar12 < 0x1001) {
            uVar29 = 0x1000;
          }
          if (uVar14 != 0) {
            uVar29 = (ulong)uVar14;
          }
          do {
            sVar23 = uVar29;
            uVar14 = (uint)sVar23;
            uVar29 = (ulong)(uVar14 * 2);
          } while (uVar14 < uVar15);
          psVar20 = (stbi_uc *)realloc(*ppsVar1,sVar23);
          if (psVar20 == (stbi_uc *)0x0) goto LAB_00143cd1;
          *ppsVar1 = psVar20;
        }
        else {
          psVar20 = *ppsVar1;
        }
        iVar16 = stbi__getn(s,psVar20 + uVar25,sVar12);
        uVar25 = (ulong)uVar15;
        bVar5 = false;
        if (iVar16 != 0) goto LAB_00143568;
        pcVar21 = "outofdata";
      }
      else {
        pcVar21 = "no PLTE";
      }
      goto LAB_00143753;
    }
    if (sVar13 == 0x49454e44) {
      if (!bVar5) {
        if (scan != 0) {
          return 1;
        }
        if (*ppsVar1 != (stbi_uc *)0x0) {
          raw_len = s->img_n * s->img_y * (z->depth * s->img_x + 7 >> 3) + s->img_y;
          psVar20 = (stbi_uc *)
                    stbi_zlib_decode_malloc_guesssize_headerflag
                              ((char *)*ppsVar1,iVar16,raw_len,(int *)&raw_len,(uint)!bVar6);
          z->expanded = psVar20;
          if (psVar20 == (stbi_uc *)0x0) {
            return 0;
          }
          free(z->idata);
          z->idata = (stbi_uc *)0x0;
          iVar16 = s->img_n + 1;
          iVar17 = s->img_n;
          if (bVar7) {
            iVar17 = iVar16;
          }
          out_n = iVar17;
          if (req_comp != 3) {
            out_n = iVar16;
          }
          if (local_4e8 != '\0') {
            out_n = iVar17;
          }
          if (iVar16 != req_comp) {
            out_n = iVar17;
          }
          s->img_out_n = out_n;
          psVar20 = z->expanded;
          uVar14 = z->depth;
          local_460 = (ulong)uVar14;
          iVar16 = out_n << (uVar14 == 0x10);
          sVar12 = z->s->img_x;
          sVar13 = z->s->img_y;
          if (bVar9 == 0) {
            iVar16 = stbi__create_png_image_raw(z,psVar20,raw_len,out_n,sVar12,sVar13,uVar14,uVar27)
            ;
            if (iVar16 == 0) {
              return 0;
            }
          }
          else {
            local_490 = raw_len;
            psVar22 = (stbi_uc *)stbi__malloc_mad3(sVar12,sVar13,iVar16,raw_len);
            sVar23 = (size_t)iVar16;
            lVar33 = 0;
            do {
              psVar4 = z->s;
              uVar14 = (&DAT_001654a0)[lVar33];
              uVar15 = (&DAT_001654e0)[lVar33];
              uVar32 = ~uVar14 + psVar4->img_x + uVar15;
              x = uVar32 / uVar15;
              uVar2 = (&DAT_001654c0)[lVar33];
              uVar3 = (&DAT_00165500)[lVar33];
              uVar24 = ~uVar2 + psVar4->img_y + uVar3;
              uVar18 = uVar24 / uVar3;
              if ((uVar15 <= uVar32) && (uVar3 <= uVar24)) {
                depth = (int)local_460;
                iVar17 = psVar4->img_n;
                iVar19 = stbi__create_png_image_raw(z,psVar20,local_490,out_n,x,uVar18,depth,uVar27)
                ;
                if (iVar19 == 0) {
                  free(psVar22);
                  return 0;
                }
                if (0 < (int)uVar18) {
                  iVar19 = uVar2 * iVar16;
                  local_4d0 = 0;
                  do {
                    if (0 < (int)x) {
                      psVar26 = z->out;
                      __dest = psVar22 + (ulong)(z->s->img_x * iVar19) + (long)(int)uVar14 * sVar23;
                      lVar30 = 0;
                      do {
                        memcpy(__dest,psVar26 + (local_4d0 * (long)(int)x + lVar30) * sVar23,sVar23)
                        ;
                        lVar30 = lVar30 + 1;
                        __dest = __dest + (long)(int)uVar15 * sVar23;
                      } while (lVar30 < (int)x);
                    }
                    local_4d0 = local_4d0 + 1;
                    iVar19 = iVar19 + uVar3 * iVar16;
                  } while (local_4d0 < uVar18);
                }
                uVar18 = (((int)(x * depth * iVar17 + 7) >> 3) + 1) * uVar18;
                free(z->out);
                psVar20 = psVar20 + uVar18;
                local_490 = local_490 - uVar18;
              }
              lVar33 = lVar33 + 1;
            } while (lVar33 != 7);
            z->out = psVar22;
          }
          if (bVar7) {
            z_00 = (stbi__png *)(ulong)z->s->img_x;
            tc_00 = (stbi__uint16 *)(ulong)z->s->img_y;
            iVar16 = (int)z->out;
            if (z->depth == 0x10) {
              stbi__compute_transparency16(z_00,tc_00,iVar16);
            }
            else {
              stbi__compute_transparency(z_00,(stbi_uc *)tc_00,iVar16);
            }
          }
          if (((bVar6) && (stbi__de_iphone_flag != 0)) && (2 < s->img_out_n)) {
            stbi__de_iphone((stbi__png *)z->s);
          }
          if (local_4e8 == '\0') {
            if (bVar7) {
              s->img_n = s->img_n + 1;
            }
LAB_00143d1a:
            free(z->expanded);
            z->expanded = (stbi_uc *)0x0;
            stbi__get32be(s);
            return 1;
          }
          s->img_n = uVar31;
          if (2 < req_comp) {
            uVar31 = req_comp;
          }
          s->img_out_n = uVar31;
          uVar27 = z->s->img_y * z->s->img_x;
          if ((-1 < (int)uVar27) && (uVar27 <= (uint)(0x7fffffff / (ulong)uVar31))) {
            psVar20 = z->out;
            psVar22 = (stbi_uc *)malloc((ulong)(uVar27 * uVar31));
            if (psVar22 != (stbi_uc *)0x0) {
              if (uVar31 == 3) {
                if (uVar27 != 0) {
                  uVar25 = 0;
                  psVar26 = psVar22;
                  do {
                    uVar29 = (ulong)psVar20[uVar25];
                    *psVar26 = palette[uVar29 * 4];
                    psVar26[1] = palette[uVar29 * 4 + 1];
                    psVar26[2] = palette[uVar29 * 4 + 2];
                    psVar26 = psVar26 + 3;
                    uVar25 = uVar25 + 1;
                  } while (uVar27 != uVar25);
                }
              }
              else if (uVar27 != 0) {
                uVar25 = 0;
                do {
                  *(undefined4 *)(psVar22 + uVar25 * 4) =
                       *(undefined4 *)(palette + (ulong)psVar20[uVar25] * 4);
                  uVar25 = uVar25 + 1;
                } while (uVar27 != uVar25);
              }
              free(psVar20);
              z->out = psVar22;
              goto LAB_00143d1a;
            }
          }
LAB_00143cd1:
          pcVar21 = "outofmem";
          goto LAB_00143753;
        }
        pcVar21 = "no IDAT";
        goto LAB_00143753;
      }
    }
    else {
LAB_00143545:
      if (!bVar5) {
        bVar5 = false;
        if ((sVar13 >> 0x1d & 1) == 0) {
          stbi__parse_png_file::invalid_chunk._0_4_ =
               sVar13 >> 0x18 | (sVar13 & 0xff0000) >> 8 | (sVar13 & 0xff00) << 8 | sVar13 << 0x18;
          *(char **)(in_FS_OFFSET + -0x10) = stbi__parse_png_file::invalid_chunk;
          return 0;
        }
        goto LAB_0014355b;
      }
    }
  }
  else if (sVar13 == 0x74524e53) {
    if (!bVar5) {
      if (*ppsVar1 != (stbi_uc *)0x0) {
        pcVar21 = "tRNS after IDAT";
        goto LAB_00143753;
      }
      if (local_4e8 == '\0') {
        uVar31 = s->img_n;
        if ((uVar31 & 1) == 0) {
          pcVar21 = "tRNS with alpha";
        }
        else {
          if (uVar31 * 2 == sVar12) {
            if (z->depth == 0x10) {
              if (0 < (int)uVar31) {
                lVar33 = 0;
                do {
                  sVar8 = stbi__get8(s);
                  sVar11 = stbi__get8(s);
                  tc16[lVar33] = CONCAT11(sVar8,sVar11);
                  lVar33 = lVar33 + 1;
                } while (lVar33 < s->img_n);
              }
            }
            else if (0 < (int)uVar31) {
              lVar33 = 0;
              do {
                stbi__get8(s);
                sVar8 = stbi__get8(s);
                tc[lVar33] = ""[z->depth] * sVar8;
                lVar33 = lVar33 + 1;
              } while (lVar33 < s->img_n);
            }
            bVar7 = true;
            bVar5 = false;
            uVar31 = 0;
            goto LAB_00143568;
          }
LAB_001437f1:
          pcVar21 = "bad tRNS len";
        }
        goto LAB_00143753;
      }
      if (scan == 2) {
        s->img_n = 4;
        return 1;
      }
      if ((uint)local_4c0 == 0) {
        pcVar21 = "tRNS before PLTE";
        goto LAB_00143753;
      }
      if ((uint)local_4c0 < sVar12) goto LAB_001437f1;
      bVar5 = false;
      uVar31 = 4;
      if (sVar12 != 0) {
        uVar28 = 0;
        do {
          sVar8 = stbi__get8(s);
          palette[uVar28 * 4 + 3] = sVar8;
          uVar28 = uVar28 + 1;
          bVar5 = false;
          uVar31 = 4;
        } while (uVar29 != uVar28);
      }
      goto LAB_00143568;
    }
  }
  else {
    if (sVar13 != 0x504c5445) {
      if (sVar13 != 0x49484452) goto LAB_00143545;
      if (!bVar5) {
        pcVar21 = "multiple IHDR";
        goto LAB_00143753;
      }
      if (sVar12 != 0xd) {
        pcVar21 = "bad IHDR len";
        goto LAB_00143753;
      }
      sVar12 = stbi__get32be(s);
      s->img_x = sVar12;
      sVar12 = stbi__get32be(s);
      s->img_y = sVar12;
      if ((0x1000000 < sVar12) || (0x1000000 < s->img_x)) {
LAB_00143772:
        pcVar21 = "too large";
LAB_00143753:
        *(char **)(in_FS_OFFSET + -0x10) = pcVar21;
        return 0;
      }
      bVar9 = stbi__get8(s);
      z->depth = (uint)bVar9;
      if ((0x10 < bVar9) || ((0x10116U >> (bVar9 & 0x1f) & 1) == 0)) {
        pcVar21 = "1/2/4/8/16-bit only";
        goto LAB_00143753;
      }
      bVar10 = stbi__get8(s);
      if (6 < bVar10) {
LAB_00143784:
        pcVar21 = "bad ctype";
        goto LAB_00143753;
      }
      uVar27 = (uint)bVar10;
      if (bVar10 == 3) {
        uVar31 = 3;
        if (z->depth == 0x10) goto LAB_00143784;
      }
      else if ((bVar10 & 1) != 0) goto LAB_00143784;
      sVar8 = stbi__get8(s);
      if (sVar8 != '\0') {
        pcVar21 = "bad comp method";
        goto LAB_00143753;
      }
      sVar8 = stbi__get8(s);
      if (sVar8 != '\0') {
        pcVar21 = "bad filter method";
        goto LAB_00143753;
      }
      bVar9 = stbi__get8(s);
      if (1 < bVar9) {
        pcVar21 = "bad interlace method";
        goto LAB_00143753;
      }
      uVar15 = s->img_x;
      if ((uVar15 == 0) || (uVar2 = s->img_y, uVar2 == 0)) {
        pcVar21 = "0-pixel image";
        goto LAB_00143753;
      }
      if ((char)uVar31 != '\0') {
        s->img_n = 1;
        bVar5 = false;
        if (uVar2 <= (uint)(0x40000000 / (ulong)uVar15 >> 2)) goto LAB_00143568;
        goto LAB_00143772;
      }
      uVar31 = (uint)(3 < bVar10) + (bVar10 & 2) + 1;
      s->img_n = uVar31;
      if ((uint)((0x40000000 / (ulong)uVar15) / (ulong)uVar31) < uVar2) goto LAB_00143772;
      bVar5 = false;
      uVar31 = 0;
      if (scan == 2) {
        return 1;
      }
LAB_00143568:
      stbi__get32be(s);
      goto LAB_001432c5;
    }
    if (!bVar5) {
      if ((sVar12 < 0x301) &&
         (uVar15 = (sVar12 & 0xffff) / 3, local_4c0 = (ulong)uVar15, uVar15 * 3 == sVar12)) {
        bVar5 = false;
        if (2 < sVar12) {
          uVar29 = 0;
          do {
            sVar8 = stbi__get8(s);
            palette[uVar29 * 4] = sVar8;
            sVar8 = stbi__get8(s);
            palette[uVar29 * 4 + 1] = sVar8;
            sVar8 = stbi__get8(s);
            palette[uVar29 * 4 + 2] = sVar8;
            palette[uVar29 * 4 + 3] = 0xff;
            uVar29 = uVar29 + 1;
          } while (local_4c0 != uVar29);
        }
        goto LAB_00143568;
      }
      pcVar21 = "invalid PLTE";
      goto LAB_00143753;
    }
  }
LAB_0014379f:
  pcVar21 = "first not IHDR";
  goto LAB_00143753;
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3]={0};
   stbi__uint16 tc16[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s);
            s->img_y = stbi__get32be(s);
            if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
            if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
            z->depth = stbi__get8(s);  if (z->depth != 1 && z->depth != 2 && z->depth != 4 && z->depth != 8 && z->depth != 16)  return stbi__err("1/2/4/8/16-bit only","PNG not supported: 1/2/4/8/16-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3 && z->depth == 16)                  return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
               if (scan == STBI__SCAN_header) return 1;
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
               // if SCAN_header, have to scan to see if we have a tRNS
            }
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               if (z->depth == 16) {
                  for (k = 0; k < s->img_n; ++k) tc16[k] = (stbi__uint16)stbi__get16be(s); // copy the values as-is
               } else {
                  for (k = 0; k < s->img_n; ++k) tc[k] = (stbi_uc)(stbi__get16be(s) & 255) * stbi__depth_scale_table[z->depth]; // non 8-bit images will be larger
               }
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) { s->img_n = pal_img_n; return 1; }
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi__uint32 idata_limit_old = idata_limit;
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               STBI_NOTUSED(idata_limit_old);
               p = (stbi_uc *) STBI_REALLOC_SIZED(z->idata, idata_limit_old, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * z->depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, z->depth, color, interlace)) return 0;
            if (has_trans) {
               if (z->depth == 16) {
                  if (!stbi__compute_transparency16(z, tc16, s->img_out_n)) return 0;
               } else {
                  if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
               }
            }
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            } else if (has_trans) {
               // non-paletted image with tRNS -> source image has (constant) alpha
               ++s->img_n;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            // end of PNG chunk, read and skip CRC
            stbi__get32be(s);
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}